

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

bool EvalChecksig(valtype *sig,valtype *pubkey,const_iterator pbegincodehash,const_iterator pend,
                 ScriptExecutionData *execdata,uint flags,BaseSignatureChecker *checker,
                 SigVersion sigversion,ScriptError *serror,bool *success)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  long lVar5;
  pointer pbVar6;
  bool bVar7;
  int iVar8;
  ScriptError SVar9;
  CScript *b;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b_00;
  undefined1 local_78 [28];
  uint uStack_5c;
  direct_or_indirect local_58;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (WITNESS_V0 < sigversion) {
    if (sigversion != TAPSCRIPT) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                    ,0x193,
                    "bool EvalChecksig(const valtype &, const valtype &, CScript::const_iterator, CScript::const_iterator, ScriptExecutionData &, unsigned int, const BaseSignatureChecker &, SigVersion, ScriptError *, bool &)"
                   );
    }
    puVar1 = (sig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (sig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    puVar3 = (pubkey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = (pubkey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    *success = puVar1 != puVar2;
    if (puVar1 == puVar2) {
LAB_0075bbbe:
      if ((long)puVar4 - (long)puVar3 == 0x20) {
        if ((puVar1 == puVar2) ||
           (iVar8 = (*checker->_vptr_BaseSignatureChecker[1])
                              (checker,puVar1,(long)puVar2 - (long)puVar1,puVar3,0x20,3,execdata,
                               serror), (char)iVar8 != '\0')) {
LAB_0075bc06:
          bVar7 = true;
          goto LAB_0075bc18;
        }
      }
      else if (puVar4 == puVar3) {
        if (serror != (ScriptError *)0x0) {
          *serror = SCRIPT_ERR_PUBKEYTYPE;
        }
      }
      else {
        if ((flags >> 0x14 & 1) == 0) goto LAB_0075bc06;
        if (serror != (ScriptError *)0x0) {
          *serror = SCRIPT_ERR_DISCOURAGE_UPGRADABLE_PUBKEYTYPE;
        }
      }
    }
    else {
      if (execdata->m_validation_weight_left_init == false) {
        __assert_fail("execdata.m_validation_weight_left_init",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                      ,0x168,
                      "bool EvalChecksigTapscript(const valtype &, const valtype &, ScriptExecutionData &, unsigned int, const BaseSignatureChecker &, SigVersion, ScriptError *, bool &)"
                     );
      }
      lVar5 = execdata->m_validation_weight_left;
      execdata->m_validation_weight_left = lVar5 + -0x32;
      if (0x31 < lVar5) goto LAB_0075bbbe;
      if (serror != (ScriptError *)0x0) {
        *serror = SCRIPT_ERR_TAPSCRIPT_VALIDATION_WEIGHT;
      }
    }
    bVar7 = false;
    goto LAB_0075bc18;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  prevector<prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator>
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents,
             pbegincodehash,pend);
  if (sigversion == BASE) {
    local_78._16_8_ = 0;
    stack0xffffffffffffffa0 = 0;
    local_78._0_8_ = (char *)0x0;
    local_78._8_8_ = 0;
    pbVar6 = (sig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    b_00._M_extent._M_extent_value =
         (long)(sig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish - (long)pbVar6;
    b_00._M_ptr = pbVar6;
    b = CScript::operator<<((CScript *)local_78,b_00);
    iVar8 = FindAndDelete((CScript *)&local_58.indirect_contents,b);
    if (0x1c < uStack_5c) {
      free((void *)local_78._0_8_);
    }
    if (((flags >> 0x10 & 1) == 0) || (iVar8 < 1)) goto LAB_0075ba67;
    SVar9 = SCRIPT_ERR_SIG_FINDANDDELETE;
LAB_0075bba2:
    if (serror != (ScriptError *)0x0) {
      *serror = SVar9;
    }
LAB_0075bba9:
    bVar7 = false;
  }
  else {
LAB_0075ba67:
    bVar7 = CheckSignatureEncoding(sig,flags,serror);
    if ((!bVar7) ||
       (bVar7 = CheckPubKeyEncoding((valtype *)
                                    (pubkey->
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    )._M_impl.super__Vector_impl_data._M_start,
                                    (uint)(pubkey->
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          )._M_impl.super__Vector_impl_data._M_finish,
                                    (SigVersion *)(ulong)flags,(ScriptError *)(ulong)sigversion),
       !bVar7)) goto LAB_0075bba9;
    iVar8 = (**checker->_vptr_BaseSignatureChecker)(checker,sig,pubkey,&local_58,(ulong)sigversion);
    *success = SUB41(iVar8,0);
    bVar7 = true;
    if (((flags >> 0xe & 1) != 0 && SUB41(iVar8,0) == false) &&
       ((sig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish !=
        (sig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start)) {
      SVar9 = SCRIPT_ERR_SIG_NULLFAIL;
      goto LAB_0075bba2;
    }
  }
  if (0x1c < local_3c) {
    free(local_58.indirect_contents.indirect);
  }
LAB_0075bc18:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

static bool EvalChecksig(const valtype& sig, const valtype& pubkey, CScript::const_iterator pbegincodehash, CScript::const_iterator pend, ScriptExecutionData& execdata, unsigned int flags, const BaseSignatureChecker& checker, SigVersion sigversion, ScriptError* serror, bool& success)
{
    switch (sigversion) {
    case SigVersion::BASE:
    case SigVersion::WITNESS_V0:
        return EvalChecksigPreTapscript(sig, pubkey, pbegincodehash, pend, flags, checker, sigversion, serror, success);
    case SigVersion::TAPSCRIPT:
        return EvalChecksigTapscript(sig, pubkey, execdata, flags, checker, sigversion, serror, success);
    case SigVersion::TAPROOT:
        // Key path spending in Taproot has no script, so this is unreachable.
        break;
    }
    assert(false);
}